

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakeDirectoryCommand.h
# Opt level: O0

cmCommand * __thiscall cmMakeDirectoryCommand::Clone(cmMakeDirectoryCommand *this)

{
  cmCommand *this_00;
  cmMakeDirectoryCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmMakeDirectoryCommand((cmMakeDirectoryCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmMakeDirectoryCommand;
    }